

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::avx512::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  RTCFormat RVar1;
  InstanceArray *this;
  RawBufferView *pRVar2;
  RawBufferView *pRVar3;
  RTCPointQueryContext *pRVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 uVar18;
  Accel *pAVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  vfloat4 a0_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 in_ZMM1 [64];
  float fVar134;
  vfloat4 a0_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 in_ZMM2 [64];
  undefined4 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  undefined1 in_ZMM3 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 in_ZMM4 [64];
  float fVar172;
  vfloat4 b0;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar193;
  undefined4 uVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 in_ZMM7 [64];
  vfloat4 a1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined8 local_d8;
  undefined4 local_d0;
  float local_cc;
  float local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Accel *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  undefined1 local_78 [16];
  float local_68;
  void *local_60;
  undefined8 local_58;
  undefined1 local_48 [16];
  
  auVar45 = in_ZMM6._0_16_;
  auVar34 = in_ZMM7._0_16_;
  auVar46 = in_ZMM17._0_16_;
  auVar32 = in_ZMM21._0_16_;
  auVar31 = in_ZMM20._0_16_;
  auVar30 = in_ZMM19._0_16_;
  auVar40 = in_ZMM18._0_16_;
  aVar41 = in_ZMM4._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  auVar38 = in_ZMM3._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  auVar35 = in_ZMM14._0_16_;
  auVar44 = in_ZMM16._0_16_;
  auVar39 = in_ZMM15._0_16_;
  a0_1.field_0 = in_ZMM2._0_16_;
  uVar23 = (ulong)prim->instID_;
  this = (InstanceArray *)(context->scene->geometries).items[uVar23].ptr;
  pAVar19 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (pAVar19 == (Accel *)0x0) {
    return false;
  }
  uVar20 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar2 = (this->l2w_buf).items;
    RVar1 = pRVar2->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar38 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                          (undefined1  [16])_DAT_01fbb140,auVar123);
        auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar140);
        auVar124._8_8_ = 0;
        auVar124._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                          (undefined1  [16])_DAT_01fbb140,auVar124);
        auVar184._8_8_ = 0;
        auVar184._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                        (undefined1  [16])_DAT_01fbb140,auVar184);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar30 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar32 = vpermt2ps_avx512vl(auVar99,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar185._8_8_ = 0;
        auVar185._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar161 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar38 = vpermt2ps_avx512vl(auVar185,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar45 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar31._0_4_));
        fVar172 = auVar45._0_4_;
        fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar31._0_4_ * -0.5;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416((uint)(fVar172 * fVar76)),0x30);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar32,ZEXT416((uint)(fVar172 * fVar161)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416((uint)(fVar172 * fVar134)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar38 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar29 * fVar172)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24))->v;
        auVar38 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x20))
                        ->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x30))->
                      v;
      }
      auVar30 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar31 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xff);
      auVar32 = vshufps_avx(auVar38,auVar38,0xff);
      auVar45 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar44 = vxorps_avx512vl(auVar40,auVar40);
      auVar40 = vshufps_avx512vl((undefined1  [16])a0_2.field_0,auVar44,0xe9);
      auVar40 = vblendps_avx(auVar40,auVar38,4);
      fVar193 = auVar31._0_4_;
      auVar34 = vfmadd213ss_fma(auVar30,auVar30,ZEXT416((uint)(fVar193 * fVar193)));
      auVar34 = vfnmadd231ss_fma(auVar34,auVar32,auVar32);
      auVar35 = vfnmadd231ss_fma(auVar34,auVar45,auVar45);
      fVar172 = auVar30._0_4_;
      auVar39 = ZEXT416((uint)(auVar45._0_4_ * fVar172));
      auVar34 = vfmadd213ss_fma(auVar32,auVar31,auVar39);
      fVar76 = auVar34._0_4_ + auVar34._0_4_;
      auVar36 = ZEXT416((uint)(auVar32._0_4_ * fVar172));
      auVar34 = vfmsub213ss_fma(auVar45,auVar31,auVar36);
      fVar161 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfmsub231ss_fma(auVar39,auVar31,auVar32);
      fVar29 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar193 * fVar193)),auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(auVar32,auVar32,auVar34);
      auVar39 = vfnmadd231ss_fma(auVar30,auVar45,auVar45);
      auVar30 = vfmadd213ss_avx512f(auVar45,auVar32,ZEXT416((uint)(fVar193 * fVar172)));
      auVar46 = vaddss_avx512f(auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(auVar31,auVar45,auVar36);
      fVar134 = auVar30._0_4_ + auVar30._0_4_;
      auVar30 = vfmsub231ss_fma(ZEXT416((uint)(fVar193 * fVar172)),auVar32,auVar45);
      fVar172 = auVar30._0_4_ + auVar30._0_4_;
      auVar30 = vfnmadd231ss_fma(auVar34,auVar32,auVar32);
      auVar31 = vfmadd231ss_fma(auVar30,auVar45,auVar45);
      uVar149 = auVar35._0_4_;
      auVar204._4_4_ = uVar149;
      auVar204._0_4_ = uVar149;
      auVar204._8_4_ = uVar149;
      auVar204._12_4_ = uVar149;
      auVar211._4_4_ = fVar76;
      auVar211._0_4_ = fVar76;
      auVar211._8_4_ = fVar76;
      auVar211._12_4_ = fVar76;
      auVar225._0_4_ = fVar161 * 0.0;
      auVar225._4_4_ = fVar161 * 0.0;
      auVar225._8_4_ = fVar161 * 1.0;
      auVar225._12_4_ = fVar161 * 0.0;
      auVar32 = ZEXT816(0x3f80000000000000);
      auVar30 = vfmadd231ps_fma(auVar225,auVar32,auVar211);
      auVar35 = SUB6416(ZEXT464(0x3f800000),0);
      auVar45 = vfmadd231ps_fma(auVar30,auVar35,auVar204);
      auVar205._4_4_ = fVar29;
      auVar205._0_4_ = fVar29;
      auVar205._8_4_ = fVar29;
      auVar205._12_4_ = fVar29;
      uVar149 = auVar39._0_4_;
      auVar212._4_4_ = uVar149;
      auVar212._0_4_ = uVar149;
      auVar212._8_4_ = uVar149;
      auVar212._12_4_ = uVar149;
      auVar30 = vbroadcastss_avx512vl(auVar46);
      auVar223._0_4_ = auVar30._0_4_ * 0.0;
      auVar223._4_4_ = auVar30._4_4_ * 0.0;
      auVar223._8_4_ = auVar30._8_4_ * 1.0;
      auVar223._12_4_ = auVar30._12_4_ * 0.0;
      auVar30 = vfmadd231ps_fma(auVar223,auVar32,auVar212);
      auVar34 = vfmadd231ps_fma(auVar30,auVar35,auVar205);
      auVar198._4_4_ = fVar134;
      auVar198._0_4_ = fVar134;
      auVar198._8_4_ = fVar134;
      auVar198._12_4_ = fVar134;
      auVar186._4_4_ = fVar172;
      auVar186._0_4_ = fVar172;
      auVar186._8_4_ = fVar172;
      auVar186._12_4_ = fVar172;
      fVar76 = auVar31._0_4_;
      auVar206._0_4_ = fVar76 * 0.0;
      auVar206._4_4_ = fVar76 * 0.0;
      auVar206._8_4_ = fVar76 * 1.0;
      auVar206._12_4_ = fVar76 * 0.0;
      auVar30 = vfmadd231ps_fma(auVar206,auVar32,auVar186);
      auVar35 = vfmadd231ps_fma(auVar30,auVar35,auVar198);
      aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vaddps_avx512vl(auVar40,auVar44);
      auVar100._0_4_ = a0_2.field_0._0_4_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar30 = vmulps_avx512vl(auVar35,auVar44);
      auVar40 = vfmadd213ps_avx512vl(auVar44,auVar34,auVar30);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar100);
      uVar149 = auVar38._0_4_;
      auVar101._4_4_ = uVar149;
      auVar101._0_4_ = uVar149;
      auVar101._8_4_ = uVar149;
      auVar101._12_4_ = uVar149;
      auVar31 = vshufps_avx512vl(auVar38,auVar38,0x55);
      auVar30 = vfmadd213ps_avx512vl(auVar31,auVar34,auVar30);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar45,auVar101);
      iVar21 = a0_1.field_0._0_4_;
      auVar102._4_4_ = iVar21;
      auVar102._0_4_ = iVar21;
      auVar102._8_4_ = iVar21;
      auVar102._12_4_ = iVar21;
      auVar38 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar31 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar31 = vmulps_avx512vl(auVar31,auVar35);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar34,auVar38);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar45,auVar102);
      iVar21 = a0.field_0._0_4_;
      a0_2.field_0.i[1] = iVar21;
      a0_2.field_0.i[0] = iVar21;
      a0_2.field_0.i[2] = iVar21;
      a0_2.field_0.i[3] = iVar21;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar32 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xaa);
      auVar125._0_4_ = auVar32._0_4_ * auVar35._0_4_;
      auVar125._4_4_ = auVar32._4_4_ * auVar35._4_4_;
      auVar125._8_4_ = auVar32._8_4_ * auVar35._8_4_;
      auVar125._12_4_ = auVar32._12_4_ * auVar35._12_4_;
      auVar32 = vfmadd231ps_fma(auVar125,auVar34,(undefined1  [16])a0_1.field_0);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar32,auVar45,(undefined1  [16])a0_2.field_0);
      auVar32 = vaddps_avx512vl((undefined1  [16])aVar41,(undefined1  [16])a0.field_0);
    }
    else if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = pRVar2->stride * uVar20;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   ZEXT416(*(uint *)(pcVar25 + lVar24 + 4));
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 8));
      auVar38 = ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc));
      auVar40 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
      auVar40 = vinsertps_avx512f(auVar40,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
      auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
      auVar30 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
      auVar31 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
      auVar31 = vinsertps_avx512f(auVar31,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                   ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
      auVar32 = vinsertps_avx512f((undefined1  [16])a0_2.field_0,
                                  ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
    }
    else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = pRVar2->stride * uVar20;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
      a0_1.field_0._8_8_ = 0;
      a0_1.field_0._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
      auVar40 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                   (undefined1  [16])_DAT_01fbb140,auVar77);
      auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                   (undefined1  [16])_DAT_01fbb140,(undefined1  [16])a0_1.field_0);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
      auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                   (undefined1  [16])_DAT_01fbb140,auVar78);
      a0_2.field_0._8_8_ = 0;
      a0_2.field_0._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
      auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                   (undefined1  [16])_DAT_01fbb140,(undefined1  [16])a0_2.field_0);
      a0.field_0 = _DAT_01fbb140;
    }
    else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = pRVar2->stride * uVar20;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
      auVar30 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
      aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc));
      auVar31 = vpermt2ps_avx512vl(auVar115,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
      auVar173._8_8_ = 0;
      auVar173._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
      fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
      fVar161 = *(float *)(pcVar25 + lVar24 + 0x28);
      fVar29 = *(float *)(pcVar25 + lVar24 + 0x2c);
      auVar32 = vpermt2ps_avx512vl(auVar173,_DAT_01fbb150,
                                   ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
      fVar134 = *(float *)(pcVar25 + lVar24 + 0x30);
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),ZEXT416((uint)fVar76),
                                ZEXT416((uint)fVar76));
      auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
      auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
      auVar38 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar40._0_4_));
      fVar172 = auVar38._0_4_;
      fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar40._0_4_ * -0.5;
      auVar38 = ZEXT416((uint)fVar172);
      auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(fVar76 * fVar172)),0x30);
      auVar40 = vinsertps_avx512f(auVar31,ZEXT416((uint)(fVar161 * fVar172)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar134 * fVar172));
      auVar31 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar134 * fVar172)),0x30);
      auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
      auVar30 = vinsertps_avx512f((undefined1  [16])a0_2.field_0,ZEXT416((uint)(fVar29 * fVar172)),
                                  0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar29 * fVar172));
    }
    else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = pRVar2->stride * uVar20;
      auVar40 = *(undefined1 (*) [16])(pcVar25 + lVar24);
      auVar30 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
      auVar31 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
      auVar32 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
    }
LAB_01f2a814:
    pRVar2 = (this->l2w_buf).items;
    RVar1 = pRVar2->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar138._8_8_ = 0;
        auVar138._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                        (undefined1  [16])_DAT_01fbb140,auVar94);
        aVar41.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                              _DAT_01fbb140,auVar138);
        auVar95._8_8_ = 0;
        auVar95._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                          (undefined1  [16])_DAT_01fbb140,auVar95);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar96);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar45 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar34 = vpermt2ps_avx512vl(auVar121,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar183._8_8_ = 0;
        auVar183._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar161 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar35 = vpermt2ps_avx512vl(auVar183,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar39 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar38._0_4_));
        fVar172 = auVar39._0_4_;
        fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar38._0_4_ * -0.5;
        auVar38 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar172 * fVar76)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar34,ZEXT416((uint)(fVar172 * fVar161)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar45,ZEXT416((uint)(fVar172 * fVar134)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar45,ZEXT416((uint)(fVar29 * fVar172)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24))->v;
        aVar41 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x10))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x20))
                        ->v;
        auVar38 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      auVar34 = vshufps_avx(auVar38,auVar38,0xff);
      auVar35 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar39 = vshufps_avx((undefined1  [16])aVar41,(undefined1  [16])aVar41,0xff);
      auVar44 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar45 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar45 = vblendps_avx(auVar45,(undefined1  [16])aVar41,4);
      fVar193 = auVar35._0_4_;
      auVar46 = vfmadd213ss_fma(auVar34,auVar34,ZEXT416((uint)(fVar193 * fVar193)));
      auVar46 = vfnmadd231ss_fma(auVar46,auVar39,auVar39);
      auVar36 = vfnmadd231ss_fma(auVar46,auVar44,auVar44);
      fVar172 = auVar34._0_4_;
      auVar42 = ZEXT416((uint)(auVar44._0_4_ * fVar172));
      auVar46 = vfmadd213ss_fma(auVar39,auVar35,auVar42);
      fVar76 = auVar46._0_4_ + auVar46._0_4_;
      auVar75 = ZEXT416((uint)(auVar39._0_4_ * fVar172));
      auVar46 = vfmsub213ss_fma(auVar44,auVar35,auVar75);
      fVar161 = auVar46._0_4_ + auVar46._0_4_;
      auVar46 = vfmsub231ss_fma(auVar42,auVar35,auVar39);
      fVar29 = auVar46._0_4_ + auVar46._0_4_;
      auVar46 = vfmsub231ss_fma(ZEXT416((uint)(fVar193 * fVar193)),auVar34,auVar34);
      auVar34 = vfmadd213ss_avx512f(auVar39,auVar39,auVar46);
      auVar42 = vfnmadd231ss_avx512f(auVar34,auVar44,auVar44);
      auVar34 = vfmadd213ss_avx512f(auVar44,auVar39,ZEXT416((uint)(fVar172 * fVar193)));
      auVar43 = vaddss_avx512f(auVar34,auVar34);
      auVar34 = vfmadd213ss_fma(auVar35,auVar44,auVar75);
      fVar134 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar172 * fVar193)),auVar39,auVar44);
      fVar172 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfnmadd231ss_fma(auVar46,auVar39,auVar39);
      auVar35 = vfmadd231ss_fma(auVar34,auVar44,auVar44);
      uVar149 = auVar36._0_4_;
      auVar208._4_4_ = uVar149;
      auVar208._0_4_ = uVar149;
      auVar208._8_4_ = uVar149;
      auVar208._12_4_ = uVar149;
      auVar217._4_4_ = fVar76;
      auVar217._0_4_ = fVar76;
      auVar217._8_4_ = fVar76;
      auVar217._12_4_ = fVar76;
      auVar226._0_4_ = fVar161 * 0.0;
      auVar226._4_4_ = fVar161 * 0.0;
      auVar226._8_4_ = fVar161 * 1.0;
      auVar226._12_4_ = fVar161 * 0.0;
      auVar46 = ZEXT816(0x3f80000000000000);
      auVar34 = vfmadd231ps_fma(auVar226,auVar46,auVar217);
      auVar36 = SUB6416(ZEXT464(0x3f800000),0);
      auVar39 = vfmadd231ps_fma(auVar34,auVar36,auVar208);
      auVar209._4_4_ = fVar29;
      auVar209._0_4_ = fVar29;
      auVar209._8_4_ = fVar29;
      auVar209._12_4_ = fVar29;
      auVar34 = vbroadcastss_avx512vl(auVar42);
      auVar44 = vbroadcastss_avx512vl(auVar43);
      auVar224._0_4_ = auVar44._0_4_ * 0.0;
      auVar224._4_4_ = auVar44._4_4_ * 0.0;
      auVar224._8_4_ = auVar44._8_4_ * 1.0;
      auVar224._12_4_ = auVar44._12_4_ * 0.0;
      auVar34 = vfmadd231ps_fma(auVar224,auVar46,auVar34);
      auVar44 = vfmadd231ps_fma(auVar34,auVar36,auVar209);
      auVar202._4_4_ = fVar134;
      auVar202._0_4_ = fVar134;
      auVar202._8_4_ = fVar134;
      auVar202._12_4_ = fVar134;
      auVar196._4_4_ = fVar172;
      auVar196._0_4_ = fVar172;
      auVar196._8_4_ = fVar172;
      auVar196._12_4_ = fVar172;
      fVar76 = auVar35._0_4_;
      auVar210._0_4_ = fVar76 * 0.0;
      auVar210._4_4_ = fVar76 * 0.0;
      auVar210._8_4_ = fVar76 * 1.0;
      auVar210._12_4_ = fVar76 * 0.0;
      auVar34 = vfmadd231ps_fma(auVar210,auVar46,auVar196);
      auVar34 = vfmadd231ps_fma(auVar34,auVar36,auVar202);
      auVar122._0_4_ = a0.field_0._0_4_;
      auVar122._4_4_ = auVar122._0_4_;
      auVar122._8_4_ = auVar122._0_4_;
      auVar122._12_4_ = auVar122._0_4_;
      fVar76 = auVar34._0_4_;
      auVar197._0_4_ = fVar76 * 0.0;
      fVar161 = auVar34._4_4_;
      auVar197._4_4_ = fVar161 * 0.0;
      fVar29 = auVar34._8_4_;
      auVar197._8_4_ = fVar29 * 0.0;
      fVar134 = auVar34._12_4_;
      auVar197._12_4_ = fVar134 * 0.0;
      auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar44,auVar197);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar34,auVar39,auVar122);
      iVar21 = aVar41.i[0];
      auVar203._4_4_ = iVar21;
      auVar203._0_4_ = iVar21;
      auVar203._8_4_ = iVar21;
      auVar203._12_4_ = iVar21;
      auVar34 = vshufps_avx((undefined1  [16])aVar41,(undefined1  [16])aVar41,0x55);
      auVar34 = vfmadd213ps_fma(auVar34,auVar44,auVar197);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar34,auVar39,auVar203);
      iVar21 = a0_1.field_0._0_4_;
      auVar169._4_4_ = iVar21;
      auVar169._0_4_ = iVar21;
      auVar169._8_4_ = iVar21;
      auVar169._12_4_ = iVar21;
      auVar34 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar35 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar139._0_4_ = fVar76 * auVar35._0_4_;
      auVar139._4_4_ = fVar161 * auVar35._4_4_;
      auVar139._8_4_ = fVar29 * auVar35._8_4_;
      auVar139._12_4_ = fVar134 * auVar35._12_4_;
      auVar34 = vfmadd231ps_fma(auVar139,auVar44,auVar34);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar34,auVar39,auVar169);
      uVar149 = auVar38._0_4_;
      auVar170._4_4_ = uVar149;
      auVar170._0_4_ = uVar149;
      auVar170._8_4_ = uVar149;
      auVar170._12_4_ = uVar149;
      auVar34 = vshufps_avx(auVar38,auVar38,0x55);
      auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
      auVar156._0_4_ = fVar76 * auVar38._0_4_;
      auVar156._4_4_ = fVar161 * auVar38._4_4_;
      auVar156._8_4_ = fVar29 * auVar38._8_4_;
      auVar156._12_4_ = fVar134 * auVar38._12_4_;
      auVar38 = vfmadd231ps_fma(auVar156,auVar44,auVar34);
      auVar34 = vfmadd231ps_fma(auVar38,auVar39,auVar170);
      auVar38._0_4_ = auVar45._0_4_ + 0.0 + auVar34._0_4_;
      auVar38._4_4_ = auVar45._4_4_ + 0.0 + auVar34._4_4_;
      auVar38._8_4_ = auVar45._8_4_ + 0.0 + auVar34._8_4_;
      auVar38._12_4_ = auVar45._12_4_ + 0.0 + auVar34._12_4_;
    }
    else if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = uVar20 * pRVar2->stride;
      auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
      auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
      auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
      auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
    }
    else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = uVar20 * pRVar2->stride;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                        (undefined1  [16])_DAT_01fbb140,auVar135);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                      (undefined1  [16])_DAT_01fbb140,auVar151);
      auVar152._8_8_ = 0;
      auVar152._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                        (undefined1  [16])_DAT_01fbb140,auVar152);
      auVar177._8_8_ = 0;
      auVar177._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
      auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                   (undefined1  [16])_DAT_01fbb140,auVar177);
    }
    else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = uVar20 * pRVar2->stride;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
      auVar45 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
      auVar34 = vpermt2ps_avx512vl(auVar89,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
      auVar178._8_8_ = 0;
      auVar178._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
      fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
      fVar161 = *(float *)(pcVar25 + lVar24 + 0x28);
      fVar29 = *(float *)(pcVar25 + lVar24 + 0x2c);
      auVar35 = vpermt2ps_avx512vl(auVar178,_DAT_01fbb150,
                                   ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
      fVar134 = *(float *)(pcVar25 + lVar24 + 0x30);
      auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),ZEXT416((uint)fVar76),
                                ZEXT416((uint)fVar76));
      auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
      auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
      auVar39 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar38._0_4_));
      fVar172 = auVar39._0_4_;
      fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar38._0_4_ * -0.5;
      auVar38 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar172 * fVar76)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar34,ZEXT416((uint)(fVar172 * fVar161)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar45,ZEXT416((uint)(fVar172 * fVar134)),0x30);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                              ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
      auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar45,ZEXT416((uint)(fVar29 * fVar172)),0x30);
    }
    else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar25 = pRVar2->ptr_ofs;
      lVar24 = uVar20 * pRVar2->stride;
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x10))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x20))->
                      v;
      auVar38 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
    }
  }
  else {
    fVar76 = (this->super_Geometry).fnumTimeSegments;
    fVar161 = (this->super_Geometry).time_range.lower;
    fVar29 = (this->super_Geometry).time_range.upper;
    auVar38 = ZEXT416((uint)fVar29);
    fVar161 = fVar76 * ((query->time - fVar161) / (fVar29 - fVar161));
    auVar36 = ZEXT416((uint)fVar161);
    auVar42 = vroundss_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),9);
    auVar43 = vminss_avx(auVar42,ZEXT416((uint)(fVar76 + -1.0)));
    auVar42 = ZEXT816(0) << 0x20;
    aVar33 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxss_avx(auVar42,auVar43);
    fVar161 = fVar161 - aVar33.v[0];
    auVar75 = ZEXT416((uint)fVar161);
    auVar43 = ZEXT416((uint)fVar161);
    iVar21 = (int)aVar33.v[0];
    lVar24 = CONCAT44((int)(uVar23 >> 0x20),iVar21);
    pRVar3 = (this->l2w_buf).items;
    pRVar2 = pRVar3 + lVar24;
    RVar1 = pRVar3[lVar24].format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      auVar38 = ZEXT416((uint)fVar161);
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar35 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar43 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar44 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar39 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar45);
        auVar43 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar44);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar39);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar75);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar45 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar35 = vpermt2ps_avx512vl(auVar43,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar39 = vpermt2ps_avx512vl(auVar56,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar44 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
        fVar193 = auVar44._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar34._0_4_ * -0.5;
        auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar76 * fVar193)),0x30);
        auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar29 * fVar193)),0x30);
        auVar44 = vinsertps_avx512f(auVar45,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar43 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar134 * fVar193)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar35 = *(undefined1 (*) [16])(pcVar25 + lVar24);
        auVar43 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar44 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        auVar39 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      pRVar2 = pRVar3 + (iVar21 + 1U);
      RVar1 = pRVar3[iVar21 + 1U].format;
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar46 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar30 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar31 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar31 = vinsertps_avx512f(auVar31,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar32 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar32 = vinsertps_avx512f(auVar32,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar46 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar30);
        auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar53);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar31);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar32);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar30 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar45 = vpermt2ps_avx512vl(auVar54,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar32 = vpermt2ps_avx512vl(auVar55,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar57._4_12_ = ZEXT812(0) << 0x20;
        auVar57._0_4_ = auVar31._0_4_;
        auVar34 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar57);
        fVar193 = auVar34._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar31._0_4_ * -0.5;
        auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(fVar76 * fVar193)),0x30);
        auVar46 = vinsertps_avx512f(auVar45,ZEXT416((uint)(fVar29 * fVar193)),0x30);
        auVar31 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar30 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar134 * fVar193)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar46 = *(undefined1 (*) [16])(pcVar25 + lVar24);
        auVar30 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar31 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        auVar32 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      auVar36 = vshufps_avx512vl(auVar39,auVar39,0xff);
      auVar42 = vshufps_avx512vl(auVar35,auVar35,0xff);
      auVar45 = vshufps_avx(auVar43,auVar43,0xff);
      auVar75 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar34 = vshufps_avx512vl(auVar32,auVar32,0xff);
      auVar56 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar53 = vshufps_avx512vl(auVar30,auVar30,0xff);
      auVar54 = vshufps_avx512vl(auVar31,auVar31,0xff);
      auVar55 = vmulss_avx512f(auVar42,auVar56);
      auVar55 = vfmadd231ss_avx512f(auVar55,auVar34,auVar36);
      auVar55 = vfmadd231ss_avx512f(auVar55,auVar53,auVar45);
      auVar55 = vfmadd231ss_avx512f(auVar55,auVar54,auVar75);
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar57 = vxorps_avx512vl(auVar55,auVar64);
      bVar6 = auVar55._0_4_ < auVar57._0_4_;
      auVar58 = vxorps_avx512vl(auVar34,auVar64);
      auVar59 = vxorps_avx512vl(auVar56,auVar64);
      auVar61 = vxorps_avx512vl(auVar53,auVar64);
      auVar37 = vxorps_avx512vl(auVar54,auVar64);
      auVar62._4_12_ = auVar34._4_12_;
      auVar62._0_4_ = (uint)bVar6 * auVar58._0_4_ + (uint)!bVar6 * auVar34._0_4_;
      auVar63._4_12_ = auVar56._4_12_;
      auVar63._0_4_ = (uint)bVar6 * auVar59._0_4_ + (uint)!bVar6 * auVar56._0_4_;
      auVar59._4_12_ = auVar53._4_12_;
      auVar59._0_4_ = (uint)bVar6 * auVar61._0_4_ + (uint)!bVar6 * auVar53._0_4_;
      auVar61._4_12_ = auVar54._4_12_;
      auVar61._0_4_ = (uint)bVar6 * auVar37._0_4_ + (uint)!bVar6 * auVar54._0_4_;
      auVar58._8_4_ = 0x7fffffff;
      auVar58._0_8_ = 0x7fffffff7fffffff;
      auVar58._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx512vl(auVar55,auVar58);
      auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar56,ZEXT416(0x3c9df1b8));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0xbd37e81c));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0x3db3edac));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0xbe5ba881));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0x3fc90fd1));
      auVar53 = vmaxss_avx512f(auVar57,auVar55);
      auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar56);
      auVar55 = ZEXT816(0) << 0x20;
      if (auVar54._0_4_ < 0.0) {
        fVar76 = sqrtf(auVar54._0_4_);
        auVar55 = ZEXT816(0) << 0x40;
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar53 = ZEXT416(auVar53._0_4_);
      }
      else {
        auVar54 = vsqrtss_avx(auVar54,auVar54);
        fVar76 = auVar54._0_4_;
      }
      auVar34 = vmaxss_avx(auVar55,ZEXT416((uint)(1.5707964 - fVar76 * auVar34._0_4_)));
      auVar54 = vxorps_avx512vl(auVar34,auVar64);
      uVar5 = vcmpss_avx512f(auVar53,auVar55,1);
      bVar6 = (bool)((byte)uVar5 & 1);
      auVar58 = ZEXT416(0x3f800000);
      uVar5 = vcmpss_avx512f(auVar58,auVar56,1);
      bVar8 = (bool)((byte)uVar5 & 1);
      fVar76 = fVar161 * (float)((uint)bVar8 * 0x7fc00000 +
                                (uint)!bVar8 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar6 * auVar54._0_4_ +
                                            (uint)!bVar6 * auVar34._0_4_)));
      auVar34 = ZEXT416((uint)(fVar76 * 0.63661975));
      auVar34 = vroundss_avx(auVar34,auVar34,9);
      auVar56 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar34,ZEXT416((uint)fVar76));
      uVar27 = (int)auVar34._0_4_ & 3;
      uVar22 = uVar27 - 1;
      fVar29 = auVar56._0_4_;
      fVar76 = fVar29 * fVar29;
      auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar76),
                                ZEXT416(0x363938a8));
      auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar76),
                                ZEXT416(0x37cfab9c));
      auVar55 = ZEXT416((uint)fVar76);
      auVar56 = vfmadd213ss_fma(auVar56,auVar55,ZEXT416(0xb9501096));
      auVar54 = vfmadd213ss_fma(auVar54,auVar55,ZEXT416(0xbab60981));
      auVar56 = vfmadd213ss_fma(auVar56,auVar55,ZEXT416(0x3c088898));
      auVar54 = vfmadd213ss_fma(auVar54,auVar55,ZEXT416(0x3d2aaaa4));
      auVar55 = ZEXT416((uint)fVar76);
      auVar56 = vfmadd213ss_fma(auVar56,auVar55,ZEXT416(0xbe2aaaab));
      uVar149 = 0;
      auVar54 = vfmadd213ss_fma(auVar54,auVar55,SUB6416(ZEXT464(0xbf000000),0));
      auVar56 = vfmadd213ss_avx512f(auVar56,auVar55,auVar58);
      auVar54 = vfmadd213ss_avx512f(auVar54,auVar55,auVar58);
      fVar29 = fVar29 * auVar56._0_4_;
      bVar7 = (byte)(int)auVar34._0_4_;
      uVar28 = (uint)(bVar7 & 1) * auVar54._0_4_ + (uint)!(bool)(bVar7 & 1) * (int)fVar29;
      auVar60._4_12_ = auVar54._4_12_;
      auVar60._0_4_ = (uint)(bVar7 & 1) * (int)fVar29 + (uint)!(bool)(bVar7 & 1) * auVar54._0_4_;
      auVar34 = vxorps_avx512vl(auVar60,auVar64);
      auVar47._0_4_ = (uint)(uVar22 < 2) * auVar34._0_4_ + (uint)(uVar22 >= 2) * auVar60._0_4_;
      auVar47._4_12_ = auVar60._4_12_;
      auVar56 = vfmsub213ss_avx512f(auVar36,auVar53,auVar62);
      auVar34 = vfmsub213ss_avx512f(auVar42,auVar53,auVar63);
      auVar54 = vfmsub213ss_avx512f(auVar45,auVar53,auVar59);
      auVar53 = vfmsub213ss_avx512f(auVar75,auVar53,auVar61);
      fVar134 = auVar34._0_4_;
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),auVar56,auVar56);
      auVar34 = vfmadd231ss_fma(auVar34,auVar54,auVar54);
      auVar34 = vfmadd231ss_fma(auVar34,auVar53,auVar53);
      auVar55 = vxorps_avx512vl(auVar40,auVar40);
      auVar48._4_12_ = auVar55._4_12_;
      auVar48._0_4_ = auVar34._0_4_;
      auVar40 = vrsqrt14ss_avx512f(auVar55,auVar48);
      fVar76 = auVar40._0_4_;
      fVar76 = fVar76 * 1.5 + fVar76 * fVar76 * fVar76 * auVar34._0_4_ * -0.5;
      auVar40 = vxorps_avx512vl(ZEXT416(uVar28),auVar64);
      fVar29 = (float)((1 < uVar27) * uVar28 + (uint)(1 >= uVar27) * auVar40._0_4_);
      auVar56 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * fVar76 * fVar29)),auVar47,auVar36
                                   );
      auVar57 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar134 * fVar76 * fVar29)),auVar47,auVar42);
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar76 * fVar29)),auVar47,auVar45);
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar76 * fVar29)),auVar75,auVar47);
      auVar53 = vsubss_avx512f(auVar58,auVar38);
      auVar54 = vmulss_avx512f(auVar38,auVar62);
      auVar54 = vfmadd231ss_avx512f(auVar54,auVar53,auVar36);
      auVar36 = vmulss_avx512f(auVar38,auVar63);
      auVar36 = vfmadd231ss_avx512f(auVar36,auVar53,auVar42);
      auVar42 = vmulss_avx512f(auVar38,auVar59);
      auVar45 = vfmadd231ss_fma(auVar42,auVar53,auVar45);
      auVar38 = vmulss_avx512f(auVar38,auVar61);
      auVar38 = vfmadd231ss_fma(auVar38,auVar53,auVar75);
      fVar29 = auVar36._0_4_;
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar54,auVar54);
      auVar36 = vfmadd231ss_fma(auVar36,auVar45,auVar45);
      auVar36 = vfmadd231ss_fma(auVar36,auVar38,auVar38);
      auVar64._4_12_ = auVar48._4_12_;
      auVar64._0_4_ = auVar36._0_4_;
      auVar42 = vrsqrt14ss_avx512f(auVar55,auVar64);
      fVar76 = auVar42._0_4_;
      fVar76 = fVar76 * 1.5 + fVar76 * fVar76 * fVar76 * auVar36._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar6 = 2 < uVar22;
      auVar49._4_12_ = auVar56._4_12_;
      auVar49._0_4_ =
           (float)((uint)bVar6 * (int)(auVar54._0_4_ * fVar76) + (uint)!bVar6 * auVar56._0_4_);
      auVar50._4_12_ = auVar57._4_12_;
      auVar50._0_4_ = (float)((uint)bVar6 * (int)(fVar29 * fVar76) + (uint)!bVar6 * auVar57._0_4_);
      auVar51._4_12_ = auVar40._4_12_;
      auVar51._0_4_ =
           (float)((uint)bVar6 * (int)(auVar45._0_4_ * fVar76) + (uint)!bVar6 * auVar40._0_4_);
      auVar52._4_12_ = auVar34._4_12_;
      auVar52._0_4_ =
           (float)((uint)bVar6 * (int)(auVar38._0_4_ * fVar76) + (uint)!bVar6 * auVar34._0_4_);
      auVar171._4_4_ = fVar161;
      auVar171._0_4_ = fVar161;
      auVar171._8_4_ = fVar161;
      auVar171._12_4_ = fVar161;
      auVar40 = vmulps_avx512vl(auVar171,auVar46);
      auVar187._0_4_ = auVar53._0_4_;
      auVar187._4_4_ = auVar187._0_4_;
      auVar187._8_4_ = auVar187._0_4_;
      auVar187._12_4_ = auVar187._0_4_;
      auVar38 = vfmadd213ps_fma(auVar35,auVar187,auVar40);
      auVar40 = vmulps_avx512vl(auVar171,auVar30);
      auVar30 = vfmadd213ps_fma(auVar43,auVar187,auVar40);
      auVar40 = vmulps_avx512vl(auVar171,auVar31);
      auVar44 = vfmadd213ps_avx512vl(auVar44,auVar187,auVar40);
      auVar40 = vmulps_avx512vl(auVar171,auVar32);
      auVar32 = vfmadd213ps_fma(auVar39,auVar187,auVar40);
      auVar40 = vshufps_avx512vl(auVar38,auVar55,0xe9);
      auVar40 = vblendps_avx(auVar40,auVar30,4);
      auVar31 = vfmadd213ss_fma(auVar49,auVar49,ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)));
      auVar31 = vfnmadd231ss_fma(auVar31,auVar51,auVar51);
      auVar34 = vfnmadd231ss_fma(auVar31,auVar52,auVar52);
      auVar31 = vfmadd213ss_fma(auVar51,auVar50,ZEXT416((uint)(auVar49._0_4_ * auVar52._0_4_)));
      fVar76 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmsub213ss_fma(auVar52,auVar50,ZEXT416((uint)(auVar49._0_4_ * auVar51._0_4_)));
      fVar161 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar52._0_4_)),auVar50,auVar51);
      fVar29 = auVar31._0_4_ + auVar31._0_4_;
      auVar45 = vfmsub231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)),auVar49,auVar49);
      auVar31 = vfmadd213ss_fma(auVar51,auVar51,auVar45);
      auVar75 = vfnmadd231ss_fma(auVar31,auVar52,auVar52);
      auVar31 = vfmadd213ss_fma(auVar52,auVar51,ZEXT416((uint)(auVar49._0_4_ * auVar50._0_4_)));
      fVar134 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmadd213ss_fma(auVar50,auVar52,ZEXT416((uint)(auVar49._0_4_ * auVar51._0_4_)));
      fVar172 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar50._0_4_)),auVar51,auVar52);
      fVar193 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfnmadd231ss_fma(auVar45,auVar51,auVar51);
      auVar37 = vfmadd231ss_fma(auVar31,auVar52,auVar52);
      uVar194 = auVar34._0_4_;
      auVar103._4_4_ = uVar194;
      auVar103._0_4_ = uVar194;
      auVar103._8_4_ = uVar194;
      auVar103._12_4_ = uVar194;
      auVar126._4_4_ = fVar76;
      auVar126._0_4_ = fVar76;
      auVar126._8_4_ = fVar76;
      auVar126._12_4_ = fVar76;
      auVar36 = ZEXT816(0x3f80000000000000);
      auVar199._0_4_ = fVar161 * 0.0;
      auVar199._4_4_ = fVar161 * 0.0;
      auVar199._8_4_ = fVar161 * 1.0;
      auVar199._12_4_ = fVar161 * 0.0;
      auVar31 = vfmadd231ps_fma(auVar199,auVar36,auVar126);
      auVar39 = SUB6416(ZEXT464(0x3f800000),0);
      auVar45 = vfmadd231ps_fma(auVar31,auVar39,auVar103);
      auVar104._4_4_ = fVar29;
      auVar104._0_4_ = fVar29;
      auVar104._8_4_ = fVar29;
      auVar104._12_4_ = fVar29;
      uVar194 = auVar75._0_4_;
      auVar34._4_4_ = uVar194;
      auVar34._0_4_ = uVar194;
      auVar34._8_4_ = uVar194;
      auVar34._12_4_ = uVar194;
      auVar221._0_4_ = fVar134 * 0.0;
      auVar221._4_4_ = fVar134 * 0.0;
      auVar221._8_4_ = fVar134 * 1.0;
      auVar221._12_4_ = fVar134 * 0.0;
      auVar31 = vfmadd231ps_fma(auVar221,auVar36,auVar34);
      auVar35 = vfmadd231ps_fma(auVar31,auVar39,auVar104);
      auVar105._4_4_ = fVar172;
      auVar105._0_4_ = fVar172;
      auVar105._8_4_ = fVar172;
      auVar105._12_4_ = fVar172;
      auVar141._4_4_ = fVar193;
      auVar141._0_4_ = fVar193;
      auVar141._8_4_ = fVar193;
      auVar141._12_4_ = fVar193;
      fVar76 = auVar37._0_4_;
      auVar157._0_4_ = fVar76 * 0.0;
      auVar157._4_4_ = fVar76 * 0.0;
      auVar157._8_4_ = fVar76 * 1.0;
      auVar157._12_4_ = fVar76 * 0.0;
      auVar31 = vfmadd231ps_fma(auVar157,auVar36,auVar141);
      auVar39 = vfmadd231ps_fma(auVar31,auVar39,auVar105);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vaddps_avx512vl(auVar40,auVar55)
      ;
      uVar194 = auVar38._0_4_;
      auVar127._4_4_ = uVar194;
      auVar127._0_4_ = uVar194;
      auVar127._8_4_ = uVar194;
      auVar127._12_4_ = uVar194;
      auVar31 = vmulps_avx512vl(auVar39,auVar55);
      auVar40 = vfmadd213ps_avx512vl(auVar55,auVar35,auVar31);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar127);
      uVar194 = auVar30._0_4_;
      auVar128._4_4_ = uVar194;
      auVar128._0_4_ = uVar194;
      auVar128._8_4_ = uVar194;
      auVar128._12_4_ = uVar194;
      auVar30 = vshufps_avx512vl(auVar30,auVar30,0x55);
      auVar30 = vfmadd213ps_avx512vl(auVar30,auVar35,auVar31);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar45,auVar128);
      auVar31 = vbroadcastss_avx512vl(auVar44);
      auVar38 = vshufps_avx512vl(auVar44,auVar44,0x55);
      auVar36 = vshufps_avx512vl(auVar44,auVar44,0xaa);
      auVar36 = vmulps_avx512vl(auVar36,auVar39);
      auVar38 = vfmadd231ps_avx512vl(auVar36,auVar35,auVar38);
      auVar31 = vfmadd231ps_avx512vl(auVar38,auVar45,auVar31);
      uVar194 = auVar32._0_4_;
      a0.field_0.i[1] = uVar194;
      a0.field_0.i[0] = uVar194;
      a0.field_0.i[2] = uVar194;
      a0.field_0.i[3] = uVar194;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar32,auVar32,0x55);
      aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar32,auVar32,0xaa);
      auVar158._0_4_ = aVar41.v[0] * auVar39._0_4_;
      auVar158._4_4_ = aVar41.v[1] * auVar39._4_4_;
      auVar158._8_4_ = aVar41.v[2] * auVar39._8_4_;
      auVar158._12_4_ = aVar41.v[3] * auVar39._12_4_;
      auVar32 = vfmadd231ps_fma(auVar158,auVar35,(undefined1  [16])a0_1.field_0);
      auVar38 = vfmadd231ps_fma(auVar32,auVar45,(undefined1  [16])a0.field_0);
      auVar32 = vaddps_avx512vl((undefined1  [16])a0_2.field_0,auVar38);
      uVar20 = (ulong)prim->primID_;
      if ((this->super_Geometry).numTimeSteps == 1) goto LAB_01f2a814;
    }
    else {
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        aVar33 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 ZEXT416(*(uint *)(pcVar25 + lVar24 + 4));
        auVar42 = ZEXT416(*(uint *)(pcVar25 + lVar24 + 8));
        auVar38 = ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc));
        auVar40 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar40 = vinsertps_avx512f(auVar40,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar30 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar31 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar31 = vinsertps_avx512f(auVar31,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar36 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar32 = vinsertps_avx512f(auVar36,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar40 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar40);
        auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar42);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar79);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar36);
        aVar33 = _DAT_01fbb140;
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar30 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar116._8_8_ = 0;
        auVar116._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar31 = vpermt2ps_avx512vl(auVar116,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar174._8_8_ = 0;
        auVar174._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        auVar34 = ZEXT416((uint)fVar29);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar32 = vpermt2ps_avx512vl(auVar174,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar38 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar40._0_4_));
        fVar193 = auVar38._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar40._0_4_ * -0.5;
        auVar38 = ZEXT416((uint)fVar193);
        auVar45 = ZEXT416((uint)(fVar76 * fVar193));
        auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(fVar76 * fVar193)),0x30);
        auVar40 = vinsertps_avx512f(auVar31,ZEXT416((uint)(fVar29 * fVar193)),0x30);
        auVar42 = ZEXT416((uint)(fVar172 * fVar193));
        auVar31 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar36 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar30 = vinsertps_avx512f(auVar36,ZEXT416((uint)(fVar134 * fVar193)),0x30);
        aVar33 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar134 * fVar193));
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar40 = *(undefined1 (*) [16])(pcVar25 + lVar24);
        auVar30 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar31 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        auVar32 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      pRVar2 = pRVar3 + (iVar21 + 1U);
      RVar1 = pRVar3[iVar21 + 1U].format;
      pcVar25 = (char *)0x0;
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar36 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar42 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        aVar33 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar35,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar150._8_8_ = 0;
        auVar150._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar117);
        auVar42 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar150);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar118);
        auVar175._8_8_ = 0;
        auVar175._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        aVar33.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                              _DAT_01fbb140,auVar175);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar38 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar39 = vpermt2ps_avx512vl(auVar83,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar176._8_8_ = 0;
        auVar176._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        auVar45 = ZEXT416((uint)fVar76);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        auVar34 = ZEXT416((uint)fVar29);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar36 = vpermt2ps_avx512vl(auVar176,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar219._4_12_ = ZEXT812(0) << 0x20;
        auVar219._0_4_ = auVar35._0_4_;
        auVar42 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
        fVar193 = auVar42._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar35._0_4_ * -0.5;
        aVar33 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar36,ZEXT416((uint)(fVar193 * fVar76)),0x30);
        auVar36 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar193 * fVar29)),0x30);
        auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar193 * fVar172)),0x30);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar42 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar134 * fVar193)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar36 = *(undefined1 (*) [16])(pcVar25 + lVar24);
        auVar42 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar38 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        aVar33 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24 + 0x30))->v;
      }
      uVar149 = (undefined4)((ulong)pcVar25 >> 0x20);
      fVar76 = 1.0 - fVar161;
      auVar37._4_4_ = fVar161;
      auVar37._0_4_ = fVar161;
      auVar37._8_4_ = fVar161;
      auVar37._12_4_ = fVar161;
      auVar84._0_4_ = fVar161 * auVar36._0_4_;
      auVar84._4_4_ = fVar161 * auVar36._4_4_;
      auVar84._8_4_ = fVar161 * auVar36._8_4_;
      auVar84._12_4_ = fVar161 * auVar36._12_4_;
      aVar41.v[1] = fVar76;
      aVar41.v[0] = fVar76;
      aVar41.v[2] = fVar76;
      aVar41.v[3] = fVar76;
      auVar40 = vfmadd213ps_avx512vl(auVar40,(undefined1  [16])aVar41,auVar84);
      auVar85._0_4_ = fVar161 * auVar42._0_4_;
      auVar85._4_4_ = fVar161 * auVar42._4_4_;
      auVar85._8_4_ = fVar161 * auVar42._8_4_;
      auVar85._12_4_ = fVar161 * auVar42._12_4_;
      auVar30 = vfmadd213ps_avx512vl(auVar30,(undefined1  [16])aVar41,auVar85);
      auVar86._0_4_ = fVar161 * auVar38._0_4_;
      auVar86._4_4_ = fVar161 * auVar38._4_4_;
      auVar86._8_4_ = fVar161 * auVar38._8_4_;
      auVar86._12_4_ = fVar161 * auVar38._12_4_;
      auVar31 = vfmadd213ps_avx512vl(auVar31,(undefined1  [16])aVar41,auVar86);
      auVar87._0_4_ = fVar161 * aVar33.v[0];
      auVar87._4_4_ = fVar161 * aVar33.v[1];
      auVar87._8_4_ = fVar161 * aVar33.v[2];
      auVar87._12_4_ = fVar161 * aVar33.v[3];
      auVar32 = vfmadd213ps_avx512vl(auVar32,(undefined1  [16])aVar41,auVar87);
    }
    fVar76 = (this->super_Geometry).fnumTimeSegments;
    fVar161 = (this->super_Geometry).time_range.lower;
    fVar29 = (this->super_Geometry).time_range.upper;
    auVar36 = ZEXT416((uint)fVar29);
    fVar161 = fVar76 * ((query->time - fVar161) / (fVar29 - fVar161));
    auVar38 = ZEXT416((uint)fVar161);
    auVar35 = vroundss_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),9);
    auVar35 = vminss_avx(auVar35,ZEXT416((uint)(fVar76 + -1.0)));
    auVar39 = ZEXT816(0) << 0x20;
    auVar35 = vmaxss_avx(auVar39,auVar35);
    fVar161 = fVar161 - auVar35._0_4_;
    auVar42 = ZEXT416((uint)fVar161);
    iVar21 = (int)auVar35._0_4_;
    pRVar3 = (this->l2w_buf).items;
    pRVar2 = pRVar3 + CONCAT44(uVar149,iVar21);
    RVar1 = pRVar3[CONCAT44(uVar149,iVar21)].format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      auVar38 = ZEXT416((uint)fVar161);
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar44 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar75 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar46 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar42 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar142._8_8_ = 0;
        auVar142._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar106);
        auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar142);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar46 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar107);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar42 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar108);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar45 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar129._8_8_ = 0;
        auVar129._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar35 = vpermt2ps_avx512vl(auVar129,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar188._8_8_ = 0;
        auVar188._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar39 = vpermt2ps_avx512vl(auVar188,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar44 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
        fVar193 = auVar44._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar34._0_4_ * -0.5;
        auVar42 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar76 * fVar193)),0x30);
        auVar44 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar29 * fVar193)),0x30);
        auVar46 = vinsertps_avx512f(auVar45,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar75 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar134 * fVar193)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar44 = *(undefined1 (*) [16])(pcVar25 + lVar24);
        auVar75 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar46 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        auVar42 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      pRVar2 = pRVar3 + (iVar21 + 1U);
      RVar1 = pRVar3[iVar21 + 1U].format;
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar45 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar34 = vinsertps_avx512f(auVar34,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar35 = vinsertps_avx512f(auVar35,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar39 = vinsertps_avx512f(auVar39,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar45 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar110);
        auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar143);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar111);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar112);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar34 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar35 = vpermt2ps_avx512vl(auVar130,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar189._8_8_ = 0;
        auVar189._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar39 = vpermt2ps_avx512vl(auVar189,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar222._4_12_ = ZEXT812(0) << 0x20;
        auVar222._0_4_ = auVar45._0_4_;
        auVar36 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
        fVar193 = auVar36._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar45._0_4_ * -0.5;
        auVar39 = vinsertps_avx512f(auVar39,ZEXT416((uint)(fVar76 * fVar193)),0x30);
        auVar45 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar29 * fVar193)),0x30);
        auVar35 = vinsertps_avx512f(auVar34,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar34 = vinsertps_avx512f(auVar34,ZEXT416((uint)(fVar134 * fVar193)),0x30);
      }
      else {
        auVar39 = auVar30;
        auVar45 = auVar40;
        auVar34 = auVar31;
        auVar35 = auVar32;
        if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar25 = pRVar2->ptr_ofs;
          lVar24 = uVar20 * pRVar2->stride;
          auVar45 = *(undefined1 (*) [16])(pcVar25 + lVar24);
          auVar34 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
          auVar35 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
          auVar39 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
        }
      }
      auVar53 = vshufps_avx512vl(auVar42,auVar42,0xff);
      auVar54 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar36 = vshufps_avx(auVar75,auVar75,0xff);
      auVar55 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar43 = vshufps_avx512vl(auVar39,auVar39,0xff);
      auVar56 = vshufps_avx512vl(auVar45,auVar45,0xff);
      auVar57 = vshufps_avx512vl(auVar34,auVar34,0xff);
      auVar58 = vshufps_avx512vl(auVar35,auVar35,0xff);
      auVar59 = vmulss_avx512f(auVar54,auVar56);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar43,auVar53);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar57,auVar36);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar58,auVar55);
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar61 = vxorps_avx512vl(auVar59,auVar60);
      bVar6 = auVar59._0_4_ < auVar61._0_4_;
      auVar37 = vxorps_avx512vl(auVar43,auVar60);
      auVar62 = vxorps_avx512vl(auVar56,auVar60);
      auVar63 = vxorps_avx512vl(auVar57,auVar60);
      auVar64 = vxorps_avx512vl(auVar58,auVar60);
      auVar65._4_12_ = auVar43._4_12_;
      auVar65._0_4_ = (uint)bVar6 * auVar37._0_4_ + (uint)!bVar6 * auVar43._0_4_;
      auVar66._4_12_ = auVar56._4_12_;
      auVar66._0_4_ = (uint)bVar6 * auVar62._0_4_ + (uint)!bVar6 * auVar56._0_4_;
      auVar67._4_12_ = auVar57._4_12_;
      auVar67._0_4_ = (uint)bVar6 * auVar63._0_4_ + (uint)!bVar6 * auVar57._0_4_;
      auVar68._4_12_ = auVar58._4_12_;
      auVar68._0_4_ = (uint)bVar6 * auVar64._0_4_ + (uint)!bVar6 * auVar58._0_4_;
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx512vl(auVar59,auVar17);
      auVar43 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar56,ZEXT416(0x3c9df1b8));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0xbd37e81c));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0x3db3edac));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0xbe5ba881));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0x3fc90fd1));
      auVar57 = vmaxss_avx512f(auVar61,auVar59);
      auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),auVar56);
      auVar59 = ZEXT816(0) << 0x20;
      if (auVar58._0_4_ < 0.0) {
        local_b8 = auVar56;
        local_a8 = auVar65;
        fVar76 = sqrtf(auVar58._0_4_);
        auVar59 = ZEXT816(0) << 0x40;
        auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar57 = ZEXT416(auVar57._0_4_);
        auVar65 = local_a8;
        auVar56 = local_b8;
      }
      else {
        auVar58 = vsqrtss_avx(auVar58,auVar58);
        fVar76 = auVar58._0_4_;
      }
      auVar37 = ZEXT416(0x3f800000);
      auVar43 = vmaxss_avx(auVar59,ZEXT416((uint)(1.5707964 - fVar76 * auVar43._0_4_)));
      auVar58 = vxorps_avx512vl(auVar43,auVar60);
      uVar5 = vcmpss_avx512f(auVar57,auVar59,1);
      bVar6 = (bool)((byte)uVar5 & 1);
      uVar5 = vcmpss_avx512f(auVar37,auVar56,1);
      bVar8 = (bool)((byte)uVar5 & 1);
      fVar76 = fVar161 * (float)((uint)bVar8 * 0x7fc00000 +
                                (uint)!bVar8 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar6 * auVar58._0_4_ +
                                            (uint)!bVar6 * auVar43._0_4_)));
      auVar43 = ZEXT416((uint)(fVar76 * 0.63661975));
      auVar43 = vroundss_avx(auVar43,auVar43,9);
      auVar56 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar43,ZEXT416((uint)fVar76));
      uVar27 = (int)auVar43._0_4_ & 3;
      uVar22 = uVar27 - 1;
      fVar29 = auVar56._0_4_;
      fVar76 = fVar29 * fVar29;
      auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar76),
                                ZEXT416(0x363938a8));
      auVar58 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar76),
                                ZEXT416(0x37cfab9c));
      auVar59 = ZEXT416((uint)fVar76);
      auVar56 = vfmadd213ss_fma(auVar56,auVar59,ZEXT416(0xb9501096));
      auVar58 = vfmadd213ss_fma(auVar58,auVar59,ZEXT416(0xbab60981));
      auVar56 = vfmadd213ss_fma(auVar56,auVar59,ZEXT416(0x3c088898));
      auVar58 = vfmadd213ss_fma(auVar58,auVar59,ZEXT416(0x3d2aaaa4));
      auVar59 = ZEXT416((uint)fVar76);
      auVar56 = vfmadd213ss_fma(auVar56,auVar59,ZEXT416(0xbe2aaaab));
      auVar58 = vfmadd213ss_fma(auVar58,auVar59,SUB6416(ZEXT464(0xbf000000),0));
      auVar56 = vfmadd213ss_avx512f(auVar56,auVar59,auVar37);
      auVar58 = vfmadd213ss_avx512f(auVar58,auVar59,auVar37);
      fVar29 = fVar29 * auVar56._0_4_;
      bVar7 = (byte)(int)auVar43._0_4_;
      uVar28 = (uint)(bVar7 & 1) * auVar58._0_4_ + (uint)!(bool)(bVar7 & 1) * (int)fVar29;
      auVar69._4_12_ = auVar58._4_12_;
      auVar69._0_4_ = (uint)(bVar7 & 1) * (int)fVar29 + (uint)!(bool)(bVar7 & 1) * auVar58._0_4_;
      auVar43 = vxorps_avx512vl(auVar69,auVar60);
      auVar70._0_4_ = (uint)(uVar22 < 2) * auVar43._0_4_ + (uint)(uVar22 >= 2) * auVar69._0_4_;
      auVar70._4_12_ = auVar69._4_12_;
      auVar56 = vfmsub213ss_avx512f(auVar53,auVar57,auVar65);
      auVar43 = vfmsub213ss_avx512f(auVar54,auVar57,auVar66);
      auVar58 = vfmsub213ss_avx512f(auVar36,auVar57,auVar67);
      auVar57 = vfmsub213ss_avx512f(auVar55,auVar57,auVar68);
      fVar134 = auVar43._0_4_;
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),auVar56,auVar56);
      auVar43 = vfmadd231ss_fma(auVar43,auVar58,auVar58);
      auVar43 = vfmadd231ss_fma(auVar43,auVar57,auVar57);
      auVar114._12_4_ = 0;
      auVar114._0_12_ = ZEXT812(0);
      auVar114 = auVar114 << 0x20;
      auVar59 = vrsqrt14ss_avx512f(auVar114,ZEXT416((uint)auVar43._0_4_));
      fVar76 = auVar59._0_4_;
      fVar76 = fVar76 * 1.5 + fVar76 * fVar76 * fVar76 * auVar43._0_4_ * -0.5;
      auVar43 = vxorps_avx512vl(ZEXT416(uVar28),auVar60);
      fVar29 = (float)((1 < uVar27) * uVar28 + (uint)(1 >= uVar27) * auVar43._0_4_);
      auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar29 * fVar76 * auVar56._0_4_)),auVar70,auVar53
                                   );
      auVar61 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar29 * fVar76 * fVar134)),auVar70,auVar54);
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar76 * auVar58._0_4_ * fVar29)),auVar70,auVar36);
      auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar76 * auVar57._0_4_)),auVar55,auVar70);
      auVar57 = vsubss_avx512f(auVar37,auVar38);
      auVar58 = vmulss_avx512f(auVar38,auVar65);
      auVar58 = vfmadd231ss_avx512f(auVar58,auVar57,auVar53);
      auVar53 = vmulss_avx512f(auVar38,auVar66);
      auVar53 = vfmadd231ss_avx512f(auVar53,auVar57,auVar54);
      auVar54 = vmulss_avx512f(auVar38,auVar67);
      auVar36 = vfmadd231ss_fma(auVar54,auVar57,auVar36);
      auVar38 = vmulss_avx512f(auVar38,auVar68);
      auVar38 = vfmadd231ss_fma(auVar38,auVar57,auVar55);
      fVar29 = auVar53._0_4_;
      auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar58,auVar58);
      auVar53 = vfmadd231ss_fma(auVar53,auVar36,auVar36);
      auVar53 = vfmadd231ss_fma(auVar53,auVar38,auVar38);
      auVar54 = vrsqrt14ss_avx512f(auVar114,ZEXT416((uint)auVar53._0_4_));
      fVar76 = auVar54._0_4_;
      fVar76 = fVar76 * 1.5 + fVar76 * fVar76 * fVar76 * auVar53._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar6 = 2 < uVar22;
      auVar71._4_12_ = auVar59._4_12_;
      auVar71._0_4_ =
           (float)((uint)bVar6 * (int)(auVar58._0_4_ * fVar76) + (uint)!bVar6 * auVar59._0_4_);
      auVar72._4_12_ = auVar61._4_12_;
      auVar72._0_4_ = (float)((uint)bVar6 * (int)(fVar29 * fVar76) + (uint)!bVar6 * auVar61._0_4_);
      auVar73._4_12_ = auVar43._4_12_;
      auVar73._0_4_ =
           (float)((uint)bVar6 * (int)(auVar36._0_4_ * fVar76) + (uint)!bVar6 * auVar43._0_4_);
      auVar74._4_12_ = auVar56._4_12_;
      auVar74._0_4_ =
           (float)((uint)bVar6 * (int)(auVar38._0_4_ * fVar76) + (uint)!bVar6 * auVar56._0_4_);
      auVar190._4_4_ = fVar161;
      auVar190._0_4_ = fVar161;
      auVar190._8_4_ = fVar161;
      auVar190._12_4_ = fVar161;
      auVar38 = vmulps_avx512vl(auVar190,auVar45);
      auVar200._0_4_ = auVar57._0_4_;
      auVar200._4_4_ = auVar200._0_4_;
      auVar200._8_4_ = auVar200._0_4_;
      auVar200._12_4_ = auVar200._0_4_;
      auVar43 = vfmadd213ps_avx512vl(auVar44,auVar200,auVar38);
      auVar38 = vmulps_avx512vl(auVar190,auVar34);
      auVar38 = vfmadd213ps_fma(auVar75,auVar200,auVar38);
      auVar45 = vmulps_avx512vl(auVar190,auVar35);
      auVar75 = vfmadd213ps_avx512vl(auVar46,auVar200,auVar45);
      auVar45 = vmulps_avx512vl(auVar190,auVar39);
      auVar34 = vfmadd213ps_fma(auVar42,auVar200,auVar45);
      auVar45 = vshufps_avx512vl(auVar43,auVar114,0xe9);
      auVar45 = vblendps_avx(auVar45,auVar38,4);
      auVar35 = vfmadd213ss_fma(auVar71,auVar71,ZEXT416((uint)(auVar72._0_4_ * auVar72._0_4_)));
      auVar35 = vfnmadd231ss_fma(auVar35,auVar73,auVar73);
      auVar44 = vfnmadd231ss_fma(auVar35,auVar74,auVar74);
      auVar35 = vfmadd213ss_fma(auVar73,auVar72,ZEXT416((uint)(auVar71._0_4_ * auVar74._0_4_)));
      fVar76 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub213ss_fma(auVar74,auVar72,ZEXT416((uint)(auVar71._0_4_ * auVar73._0_4_)));
      fVar161 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar74._0_4_)),auVar72,auVar73);
      fVar29 = auVar35._0_4_ + auVar35._0_4_;
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar72._0_4_)),auVar71,auVar71);
      auVar35 = vfmadd213ss_fma(auVar73,auVar73,auVar39);
      auVar36 = vfnmadd231ss_fma(auVar35,auVar74,auVar74);
      auVar35 = vfmadd213ss_fma(auVar74,auVar73,ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)));
      fVar134 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmadd213ss_fma(auVar72,auVar74,ZEXT416((uint)(auVar71._0_4_ * auVar73._0_4_)));
      fVar172 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),auVar73,auVar74);
      fVar193 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfnmadd231ss_fma(auVar39,auVar73,auVar73);
      auVar46 = vfmadd231ss_fma(auVar35,auVar74,auVar74);
      uVar149 = auVar44._0_4_;
      auVar131._4_4_ = uVar149;
      auVar131._0_4_ = uVar149;
      auVar131._8_4_ = uVar149;
      auVar131._12_4_ = uVar149;
      auVar144._4_4_ = fVar76;
      auVar144._0_4_ = fVar76;
      auVar144._8_4_ = fVar76;
      auVar144._12_4_ = fVar76;
      auVar218._0_4_ = fVar161 * 0.0;
      auVar218._4_4_ = fVar161 * 0.0;
      auVar218._8_4_ = fVar161 * 1.0;
      auVar218._12_4_ = fVar161 * 0.0;
      auVar42 = ZEXT816(0x3f80000000000000);
      auVar35 = vfmadd231ps_fma(auVar218,auVar42,auVar144);
      auVar56 = SUB6416(ZEXT464(0x3f800000),0);
      auVar39 = vfmadd231ps_fma(auVar35,auVar56,auVar131);
      auVar132._4_4_ = fVar29;
      auVar132._0_4_ = fVar29;
      auVar132._8_4_ = fVar29;
      auVar132._12_4_ = fVar29;
      uVar149 = auVar36._0_4_;
      auVar145._4_4_ = uVar149;
      auVar145._0_4_ = uVar149;
      auVar145._8_4_ = uVar149;
      auVar145._12_4_ = uVar149;
      auVar213._0_4_ = fVar134 * 0.0;
      auVar213._4_4_ = fVar134 * 0.0;
      auVar213._8_4_ = fVar134 * 1.0;
      auVar213._12_4_ = fVar134 * 0.0;
      auVar35 = vfmadd231ps_fma(auVar213,auVar42,auVar145);
      auVar44 = vfmadd231ps_fma(auVar35,auVar56,auVar132);
      auVar133._4_4_ = fVar172;
      auVar133._0_4_ = fVar172;
      auVar133._8_4_ = fVar172;
      auVar133._12_4_ = fVar172;
      auVar146._4_4_ = fVar193;
      auVar146._0_4_ = fVar193;
      auVar146._8_4_ = fVar193;
      auVar146._12_4_ = fVar193;
      fVar76 = auVar46._0_4_;
      auVar159._0_4_ = fVar76 * 0.0;
      auVar159._4_4_ = fVar76 * 0.0;
      auVar159._8_4_ = fVar76 * 1.0;
      auVar159._12_4_ = fVar76 * 0.0;
      auVar35 = vfmadd231ps_fma(auVar159,auVar42,auVar146);
      auVar35 = vfmadd231ps_fma(auVar35,auVar56,auVar133);
      auVar46 = vbroadcastss_avx512vl(auVar43);
      fVar76 = auVar35._0_4_;
      auVar147._0_4_ = fVar76 * 0.0;
      fVar161 = auVar35._4_4_;
      auVar147._4_4_ = fVar161 * 0.0;
      fVar29 = auVar35._8_4_;
      auVar147._8_4_ = fVar29 * 0.0;
      fVar134 = auVar35._12_4_;
      auVar147._12_4_ = fVar134 * 0.0;
      auVar35 = vfmadd213ps_fma(auVar114,auVar44,auVar147);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar35,auVar39,auVar46);
      uVar149 = auVar38._0_4_;
      auVar191._4_4_ = uVar149;
      auVar191._0_4_ = uVar149;
      auVar191._8_4_ = uVar149;
      auVar191._12_4_ = uVar149;
      auVar38 = vshufps_avx(auVar38,auVar38,0x55);
      auVar38 = vfmadd213ps_fma(auVar38,auVar44,auVar147);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar38,auVar39,auVar191);
      auVar35 = vbroadcastss_avx512vl(auVar75);
      auVar38 = vshufps_avx512vl(auVar75,auVar75,0x55);
      auVar46 = vshufps_avx512vl(auVar75,auVar75,0xaa);
      auVar148._0_4_ = auVar46._0_4_ * fVar76;
      auVar148._4_4_ = auVar46._4_4_ * fVar161;
      auVar148._8_4_ = auVar46._8_4_ * fVar29;
      auVar148._12_4_ = auVar46._12_4_ * fVar134;
      auVar38 = vfmadd231ps_fma(auVar148,auVar44,auVar38);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar38,auVar39,auVar35);
      uVar149 = auVar34._0_4_;
      auVar192._4_4_ = uVar149;
      auVar192._0_4_ = uVar149;
      auVar192._8_4_ = uVar149;
      auVar192._12_4_ = uVar149;
      auVar38 = vshufps_avx(auVar34,auVar34,0x55);
      auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
      auVar160._0_4_ = auVar34._0_4_ * fVar76;
      auVar160._4_4_ = auVar34._4_4_ * fVar161;
      auVar160._8_4_ = auVar34._8_4_ * fVar29;
      auVar160._12_4_ = auVar34._12_4_ * fVar134;
      auVar38 = vfmadd231ps_fma(auVar160,auVar44,auVar38);
      auVar34 = vfmadd231ps_fma(auVar38,auVar39,auVar192);
      auVar38._0_4_ = auVar45._0_4_ + 0.0 + auVar34._0_4_;
      auVar38._4_4_ = auVar45._4_4_ + 0.0 + auVar34._4_4_;
      auVar38._8_4_ = auVar45._8_4_ + 0.0 + auVar34._8_4_;
      auVar38._12_4_ = auVar45._12_4_ + 0.0 + auVar34._12_4_;
    }
    else {
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar44 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar36 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar153._8_8_ = 0;
        auVar153._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar136);
        auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar153);
        auVar154._8_8_ = 0;
        auVar154._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar154);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar37);
        aVar41 = _DAT_01fbb140;
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar35 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar39 = vpermt2ps_avx512vl(auVar91,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar179._8_8_ = 0;
        auVar179._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        auVar45 = ZEXT416((uint)fVar76);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        auVar34 = ZEXT416((uint)fVar29);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar44 = vpermt2ps_avx512vl(auVar179,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar46 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar38._0_4_));
        fVar193 = auVar46._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar38._0_4_ * -0.5;
        auVar36 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar193 * fVar76)),0x30);
        auVar38 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar193 * fVar29)),0x30);
        auVar37 = ZEXT416((uint)(fVar134 * fVar193));
        auVar39 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar193 * fVar172)),0x30);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar134 * fVar193)),0x30);
        aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc));
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = pRVar2->stride * uVar20;
        auVar38 = *(undefined1 (*) [16])(pcVar25 + lVar24);
        auVar35 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar39 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        auVar36 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      pRVar2 = pRVar3 + (iVar21 + 1U);
      RVar1 = pRVar3[iVar21 + 1U].format;
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x10)),0x1c);
        aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x20)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x14)),0x1c);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),0x28);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),0x1c);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x28)),0x28);
        auVar44 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x1c)),0x1c);
        auVar37 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = *(ulong *)(pcVar25 + lVar24 + 4);
        auVar201._8_8_ = 0;
        auVar201._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        aVar41.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24)),_DAT_01fbb140,
                                              auVar180);
        auVar45 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                     (undefined1  [16])_DAT_01fbb140,auVar201);
        auVar181._8_8_ = 0;
        auVar181._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)),
                                     (undefined1  [16])_DAT_01fbb140,auVar181);
        auVar214._8_8_ = 0;
        auVar214._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x28);
        auVar37 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x24)),
                                     (undefined1  [16])_DAT_01fbb140,auVar214);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        auVar162._8_8_ = 0;
        auVar162._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x10);
        auVar45 = vinsertps_avx(auVar162,ZEXT416(*(uint *)(pcVar25 + lVar24 + 8)),0x20);
        auVar163._8_8_ = 0;
        auVar163._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x34);
        auVar44 = vpermt2ps_avx512vl(auVar163,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar25 + lVar24)));
        auVar215._8_8_ = 0;
        auVar215._0_8_ = *(ulong *)(pcVar25 + lVar24 + 0x1c);
        fVar76 = *(float *)(pcVar25 + lVar24 + 0x24);
        fVar29 = *(float *)(pcVar25 + lVar24 + 0x28);
        fVar134 = *(float *)(pcVar25 + lVar24 + 0x2c);
        auVar46 = vpermt2ps_avx512vl(auVar215,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x18)));
        fVar172 = *(float *)(pcVar25 + lVar24 + 0x30);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar76));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar227._4_12_ = ZEXT812(0) << 0x20;
        auVar227._0_4_ = auVar34._0_4_;
        auVar42 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
        fVar193 = auVar42._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar34._0_4_ * -0.5;
        auVar37 = vinsertps_avx(auVar46,ZEXT416((uint)(fVar76 * fVar193)),0x30);
        aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar44,ZEXT416((uint)(fVar29 * fVar193)),0x30);
        auVar34 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar193 * fVar172)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(pcVar25 + lVar24 + 0xc)),
                                ZEXT416(*(uint *)(pcVar25 + lVar24 + 4)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar25 + lVar24 + 0x3c)),0x20);
        auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar134 * fVar193)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar25 = pRVar2->ptr_ofs;
        lVar24 = uVar20 * pRVar2->stride;
        aVar41 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar25 + lVar24))->v;
        auVar45 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x10);
        auVar34 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x20);
        auVar37 = *(undefined1 (*) [16])(pcVar25 + lVar24 + 0x30);
      }
      fVar76 = 1.0 - fVar161;
      auVar164._0_4_ = fVar161 * aVar41.v[0];
      auVar164._4_4_ = fVar161 * aVar41.v[1];
      auVar164._8_4_ = fVar161 * aVar41.v[2];
      auVar164._12_4_ = fVar161 * aVar41.v[3];
      auVar207._4_4_ = fVar76;
      auVar207._0_4_ = fVar76;
      auVar207._8_4_ = fVar76;
      auVar207._12_4_ = fVar76;
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar38,auVar207,auVar164);
      auVar165._0_4_ = fVar161 * auVar45._0_4_;
      auVar165._4_4_ = fVar161 * auVar45._4_4_;
      auVar165._8_4_ = fVar161 * auVar45._8_4_;
      auVar165._12_4_ = fVar161 * auVar45._12_4_;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd213ps_fma(auVar35,auVar207,auVar165);
      auVar166._0_4_ = fVar161 * auVar34._0_4_;
      auVar166._4_4_ = fVar161 * auVar34._4_4_;
      auVar166._8_4_ = fVar161 * auVar34._8_4_;
      auVar166._12_4_ = fVar161 * auVar34._12_4_;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar39,auVar207,auVar166);
      auVar167._0_4_ = fVar161 * auVar37._0_4_;
      auVar167._4_4_ = fVar161 * auVar37._4_4_;
      auVar167._8_4_ = fVar161 * auVar37._8_4_;
      auVar167._12_4_ = fVar161 * auVar37._12_4_;
      auVar38 = vfmadd213ps_fma(auVar36,auVar207,auVar167);
    }
  }
  auVar45 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
  auVar34 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar195._0_4_ = a0_1.field_0._0_4_ * auVar34._0_4_;
  auVar195._4_4_ = a0_1.field_0._4_4_ * auVar34._4_4_;
  auVar195._8_4_ = a0_1.field_0._8_4_ * auVar34._8_4_;
  auVar195._12_4_ = a0_1.field_0._12_4_ * auVar34._12_4_;
  auVar44 = vfmsub231ps_fma(auVar195,(undefined1  [16])a0.field_0,auVar45);
  auVar35 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
  auVar168._0_4_ = a0_2.field_0._0_4_ * auVar45._0_4_;
  auVar168._4_4_ = a0_2.field_0._4_4_ * auVar45._4_4_;
  auVar168._8_4_ = a0_2.field_0._8_4_ * auVar45._8_4_;
  auVar168._12_4_ = a0_2.field_0._12_4_ * auVar45._12_4_;
  auVar46 = vfmsub231ps_fma(auVar168,auVar39,(undefined1  [16])a0_1.field_0);
  auVar119._0_4_ = auVar39._0_4_ * a0.field_0._0_4_;
  auVar119._4_4_ = auVar39._4_4_ * a0.field_0._4_4_;
  auVar119._8_4_ = auVar39._8_4_ * a0.field_0._8_4_;
  auVar119._12_4_ = auVar39._12_4_ * a0.field_0._12_4_;
  auVar39 = vfmsub231ps_fma(auVar119,(undefined1  [16])a0_2.field_0,auVar34);
  auVar45 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar34 = vunpcklps_avx(auVar35,auVar45);
  auVar39 = vunpcklps_avx(auVar44,auVar39);
  auVar45 = vinsertps_avx(auVar46,auVar46,0x4a);
  auVar39 = vunpcklps_avx(auVar39,ZEXT416(auVar46._0_4_));
  auVar44 = vunpcklps_avx(auVar34,auVar45);
  auVar34 = vunpckhps_avx(auVar34,auVar45);
  auVar45 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar35,0x7f);
  auVar92._0_4_ = auVar45._0_4_;
  auVar92._4_4_ = auVar92._0_4_;
  auVar92._8_4_ = auVar92._0_4_;
  auVar92._12_4_ = auVar92._0_4_;
  auVar45 = vdivps_avx(auVar44,auVar92);
  auVar34 = vdivps_avx(auVar34,auVar92);
  auVar35 = vdivps_avx(auVar39,auVar92);
  uVar149 = auVar38._0_4_;
  auVar93._4_4_ = uVar149;
  auVar93._0_4_ = uVar149;
  auVar93._8_4_ = uVar149;
  auVar93._12_4_ = uVar149;
  auVar39 = vshufps_avx(auVar38,auVar38,0x55);
  auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar137._0_4_ = auVar38._0_4_ * auVar35._0_4_;
  auVar137._4_4_ = auVar38._4_4_ * auVar35._4_4_;
  auVar137._8_4_ = auVar38._8_4_ * auVar35._8_4_;
  auVar137._12_4_ = auVar38._12_4_ * auVar35._12_4_;
  auVar38 = vfmadd231ps_fma(auVar137,auVar34,auVar39);
  auVar38 = vfmadd231ps_fma(auVar38,auVar45,auVar93);
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar38 = vxorps_avx512vl(auVar38,auVar9);
  uVar149 = 2;
  bVar6 = true;
  local_68 = 0.0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar39 = vdpps_avx(auVar45,auVar34,0x7f);
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl(auVar39,auVar10);
    if (auVar39._0_4_ <= 1e-05) {
      auVar39 = vdpps_avx(auVar45,auVar35,0x7f);
      auVar11._8_4_ = 0x7fffffff;
      auVar11._0_8_ = 0x7fffffff7fffffff;
      auVar11._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx512vl(auVar39,auVar11);
      if (auVar39._0_4_ <= 1e-05) {
        auVar39 = vdpps_avx(auVar34,auVar35,0x7f);
        auVar12._8_4_ = 0x7fffffff;
        auVar12._0_8_ = 0x7fffffff7fffffff;
        auVar12._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx512vl(auVar39,auVar12);
        if (auVar39._0_4_ <= 1e-05) {
          auVar44 = vdpps_avx(auVar45,auVar45,0x7f);
          auVar46 = vdpps_avx(auVar34,auVar34,0x7f);
          fVar76 = auVar44._0_4_;
          auVar155._8_4_ = 0x7fffffff;
          auVar155._0_8_ = 0x7fffffff7fffffff;
          auVar155._12_4_ = 0x7fffffff;
          auVar39 = vandps_avx(ZEXT416((uint)(fVar76 - auVar46._0_4_)),auVar155);
          if (auVar39._0_4_ <= 1e-05) {
            auVar36 = vdpps_avx(auVar35,auVar35,0x7f);
            auVar39 = vandps_avx(ZEXT416((uint)(fVar76 - auVar36._0_4_)),auVar155);
            local_68 = 0.0;
            if ((auVar39._0_4_ <= 1e-05) &&
               (auVar39 = vandps_avx(ZEXT416((uint)(auVar46._0_4_ - auVar36._0_4_)),auVar155),
               auVar39._0_4_ <= 1e-05)) {
              uVar149 = 1;
              if (fVar76 < 0.0) {
                local_68 = sqrtf(fVar76);
              }
              else {
                auVar39 = vsqrtss_avx(auVar44,auVar44);
                local_68 = auVar39._0_4_;
              }
              bVar6 = false;
            }
          }
        }
      }
    }
  }
  pRVar4 = context->userContext;
  uVar27 = pRVar4->instStackSize;
  auVar120._8_8_ = 0;
  auVar120._0_4_ = prim->primID_;
  auVar120._4_4_ = prim->instID_;
  auVar39 = vprolq_avx512vl(auVar120,0x20);
  *(long *)(pRVar4->instID + uVar27) = auVar39._0_8_;
  *(undefined1 (*) [16])pRVar4->world2inst[uVar27] = auVar45;
  *(undefined1 (*) [16])(pRVar4->world2inst[uVar27] + 4) = auVar34;
  *(undefined1 (*) [16])(pRVar4->world2inst[uVar27] + 8) = auVar35;
  *(undefined1 (*) [16])(pRVar4->world2inst[uVar27] + 0xc) = auVar38;
  *(undefined1 (*) [16])pRVar4->inst2world[uVar27] = auVar40;
  *(undefined1 (*) [16])(pRVar4->inst2world[uVar27] + 4) = auVar30;
  *(undefined1 (*) [16])(pRVar4->inst2world[uVar27] + 8) = auVar31;
  *(undefined1 (*) [16])(pRVar4->inst2world[uVar27] + 0xc) = auVar32;
  pRVar4->instStackSize = pRVar4->instStackSize + 1;
  local_cc = query->time;
  uVar194 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  auVar13._4_4_ = uVar194;
  auVar13._0_4_ = uVar194;
  auVar13._8_4_ = uVar194;
  auVar13._12_4_ = uVar194;
  auVar40 = vfmadd132ps_avx512vl(auVar35,auVar38,auVar13);
  uVar194 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  auVar14._4_4_ = uVar194;
  auVar14._0_4_ = uVar194;
  auVar14._8_4_ = uVar194;
  auVar14._12_4_ = uVar194;
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar34,auVar14);
  uVar194 = *(undefined4 *)&(query->p).field_0;
  auVar15._4_4_ = uVar194;
  auVar15._0_4_ = uVar194;
  auVar15._8_4_ = uVar194;
  auVar15._12_4_ = uVar194;
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar15);
  local_d8 = vmovlps_avx(auVar40);
  local_d0 = vextractps_avx(auVar40,2);
  local_c8 = local_68 * query->radius;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78._0_8_ = context->func;
  local_78._8_8_ = context->userContext;
  local_58 = 0xffffffffffffffff;
  fVar76 = local_88->radius;
  local_48._4_4_ = fVar76;
  local_48._0_4_ = fVar76;
  local_48._8_4_ = fVar76;
  local_48._12_4_ = fVar76;
  if (bVar6) {
    if (fVar76 < INFINITY) {
      lVar24 = vpextrq_avx(local_78,1);
      if (*(int *)(lVar24 + 0x88) != 0) {
        lVar26 = (ulong)(*(int *)(lVar24 + 0x88) - 1) * 0x40;
        auVar40 = *(undefined1 (*) [16])(lVar24 + lVar26);
        auVar30 = *(undefined1 (*) [16])(lVar24 + 0x10 + lVar26);
        auVar31 = *(undefined1 (*) [16])(lVar24 + 0x20 + lVar26);
        auVar32 = *(undefined1 (*) [16])(lVar24 + 0x30 + lVar26);
        auVar182._4_4_ = fVar76;
        auVar182._0_4_ = fVar76;
        auVar182._8_4_ = fVar76;
        auVar182._12_4_ = fVar76;
        auVar35 = vfnmadd213ps_fma(auVar31,auVar182,auVar32);
        auVar39 = vfnmadd213ps_fma(auVar30,auVar182,auVar35);
        auVar38 = vfnmadd213ps_fma(auVar40,auVar182,auVar39);
        auVar216._8_4_ = 0x7f800000;
        auVar216._0_8_ = 0x7f8000007f800000;
        auVar216._12_4_ = 0x7f800000;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar45 = vminps_avx(auVar216,auVar38);
        auVar38 = vmaxps_avx(auVar220,auVar38);
        auVar34 = vfmadd213ps_fma(auVar31,local_48,auVar32);
        auVar44 = vfnmadd213ps_fma(auVar30,auVar182,auVar34);
        auVar31 = vfnmadd213ps_fma(auVar40,auVar182,auVar44);
        auVar32 = vminps_avx(auVar45,auVar31);
        auVar31 = vmaxps_avx(auVar38,auVar31);
        auVar38 = vfmadd231ps_fma(auVar35,local_48,auVar30);
        auVar45 = vfnmadd213ps_fma(auVar40,auVar182,auVar38);
        auVar32 = vminps_avx(auVar32,auVar45);
        auVar31 = vmaxps_avx(auVar31,auVar45);
        auVar45 = vfmadd231ps_fma(auVar34,local_48,auVar30);
        auVar30 = vfnmadd213ps_fma(auVar182,auVar40,auVar45);
        auVar32 = vminps_avx(auVar32,auVar30);
        auVar30 = vmaxps_avx(auVar31,auVar30);
        auVar34 = vfmadd231ps_fma(auVar39,local_48,auVar40);
        auVar31 = vminps_avx(auVar32,auVar34);
        auVar30 = vmaxps_avx(auVar30,auVar34);
        auVar32 = vfmadd231ps_fma(auVar44,local_48,auVar40);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar30 = vmaxps_avx(auVar30,auVar32);
        auVar32 = vfmadd231ps_fma(auVar38,local_48,auVar40);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar30 = vmaxps_avx(auVar30,auVar32);
        auVar40 = vfmadd231ps_fma(auVar45,local_48,auVar40);
        auVar31 = vminps_avx(auVar31,auVar40);
        auVar40 = vmaxps_avx(auVar30,auVar40);
        auVar40 = vsubps_avx(auVar40,auVar31);
        auVar16._8_4_ = 0x3f000000;
        auVar16._0_8_ = 0x3f0000003f000000;
        auVar16._12_4_ = 0x3f000000;
        local_48 = vmulps_avx512vl(auVar40,auVar16);
      }
    }
  }
  else {
    fVar76 = local_68 * fVar76;
    local_48._4_4_ = fVar76;
    local_48._0_4_ = fVar76;
    local_48._8_4_ = fVar76;
    local_48._12_4_ = fVar76;
  }
  local_98 = pAVar19;
  local_80 = uVar149;
  uVar18 = (**(code **)&pAVar19->field_0x88)(&(pAVar19->super_AccelData).field_0x58,&local_d8);
  pRVar4 = context->userContext;
  uVar27 = pRVar4->instStackSize - 1;
  pRVar4->instStackSize = uVar27;
  pRVar4->instID[uVar27] = 0xffffffff;
  pRVar4->instPrimID[pRVar4->instStackSize] = 0xffffffff;
  return (bool)uVar18;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }